

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestIteratorTestindexes::runTestCase(TestIteratorTestindexes *this)

{
  TestResult *pTVar1;
  bool bVar2;
  Value *pVVar3;
  char *pcVar4;
  int __c;
  int __c_00;
  string *psVar5;
  allocator local_179;
  ValueIterator it;
  undefined1 local_168 [32];
  string local_148;
  Value json;
  Value local_100;
  Value local_d8;
  Value local_b0;
  Value local_88;
  Value local_60;
  Value local_38;
  
  Json::Value::Value(&json,nullValue);
  Json::Value::Value(&local_38,"a");
  pVVar3 = Json::Value::operator[](&json,0);
  Json::Value::operator=(pVVar3,&local_38);
  Json::Value::~Value(&local_38);
  Json::Value::Value(&local_60,"b");
  pVVar3 = Json::Value::operator[](&json,1);
  Json::Value::operator=(pVVar3,&local_60);
  Json::Value::~Value(&local_60);
  Json::Value::begin((Value *)&it);
  Json::Value::end((Value *)local_168);
  bVar2 = Json::ValueIteratorBase::operator!=(&it.super_ValueIteratorBase,(SelfType *)local_168);
  if (!bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_IteratorTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x939,"it != json.end()");
  }
  pTVar1 = (this->super_IteratorTest).super_TestCase.result_;
  Json::Value::Value(&local_88,0);
  Json::ValueIteratorBase::key(&local_b0,&it.super_ValueIteratorBase);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar1,&local_88,&local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x93a,"Json::Value(Json::ArrayIndex(0)) == it.key()");
  Json::Value::~Value(&local_b0);
  Json::Value::~Value(&local_88);
  pTVar1 = (this->super_IteratorTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)local_168,"",&local_179);
  Json::ValueIteratorBase::name_abi_cxx11_((string *)(local_168 + 0x20),&it.super_ValueIteratorBase)
  ;
  psVar5 = (string *)local_168;
  JsonTest::checkStringEqual
            (pTVar1,psVar5,(string *)(local_168 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x93b,"\"\" == it.name()");
  std::__cxx11::string::~string((string *)(local_168 + 0x20));
  std::__cxx11::string::~string((string *)local_168);
  pTVar1 = (this->super_IteratorTest).super_TestCase.result_;
  pcVar4 = Json::ValueIteratorBase::index(&it.super_ValueIteratorBase,(char *)psVar5,__c);
  JsonTest::checkEqual<int,unsigned_int>
            (pTVar1,0,(uint)pcVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x93c,"0 == it.index()");
  Json::ValueIteratorBase::increment(&it.super_ValueIteratorBase);
  Json::Value::end((Value *)local_168);
  bVar2 = Json::ValueIteratorBase::operator!=(&it.super_ValueIteratorBase,(SelfType *)local_168);
  if (!bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_IteratorTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x93e,"it != json.end()");
  }
  pTVar1 = (this->super_IteratorTest).super_TestCase.result_;
  Json::Value::Value(&local_d8,1);
  Json::ValueIteratorBase::key(&local_100,&it.super_ValueIteratorBase);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar1,&local_d8,&local_100,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x93f,"Json::Value(Json::ArrayIndex(1)) == it.key()");
  Json::Value::~Value(&local_100);
  Json::Value::~Value(&local_d8);
  pTVar1 = (this->super_IteratorTest).super_TestCase.result_;
  std::__cxx11::string::string((string *)local_168,"",&local_179);
  Json::ValueIteratorBase::name_abi_cxx11_((string *)(local_168 + 0x20),&it.super_ValueIteratorBase)
  ;
  psVar5 = (string *)local_168;
  JsonTest::checkStringEqual
            (pTVar1,psVar5,(string *)(local_168 + 0x20),
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x940,"\"\" == it.name()");
  std::__cxx11::string::~string((string *)(local_168 + 0x20));
  std::__cxx11::string::~string((string *)local_168);
  pTVar1 = (this->super_IteratorTest).super_TestCase.result_;
  pcVar4 = Json::ValueIteratorBase::index(&it.super_ValueIteratorBase,(char *)psVar5,__c_00);
  JsonTest::checkEqual<int,unsigned_int>
            (pTVar1,1,(uint)pcVar4,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
             ,0x941,"1 == it.index()");
  Json::ValueIteratorBase::increment(&it.super_ValueIteratorBase);
  Json::Value::end((Value *)local_168);
  bVar2 = Json::ValueIteratorBase::isEqual(&it.super_ValueIteratorBase,(SelfType *)local_168);
  if (!bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_IteratorTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
               ,0x943,"it == json.end()");
  }
  Json::Value::~Value(&json);
  return;
}

Assistant:

JSONTEST_FIXTURE(IteratorTest, indexes) {
  Json::Value json;
  json[0] = "a";
  json[1] = "b";
  Json::ValueIterator it = json.begin();
  JSONTEST_ASSERT(it != json.end());
  JSONTEST_ASSERT_EQUAL(Json::Value(Json::ArrayIndex(0)), it.key());
  JSONTEST_ASSERT_STRING_EQUAL("", it.name());
  JSONTEST_ASSERT_EQUAL(0, it.index());
  ++it;
  JSONTEST_ASSERT(it != json.end());
  JSONTEST_ASSERT_EQUAL(Json::Value(Json::ArrayIndex(1)), it.key());
  JSONTEST_ASSERT_STRING_EQUAL("", it.name());
  JSONTEST_ASSERT_EQUAL(1, it.index());
  ++it;
  JSONTEST_ASSERT(it == json.end());
}